

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

ps_lattice_t * ps_lattice_read(ps_decoder_t *ps,char *file)

{
  float64 fVar1;
  int iVar2;
  uint uVar3;
  int32 iVar4;
  s3wid_t sVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ps_lattice_t *dag;
  dict_t *pdVar9;
  logmath_t *plVar10;
  long lVar11;
  listelem_alloc_t *plVar12;
  FILE *fh;
  lineiter_t *plVar13;
  void *ptr;
  char *pcVar14;
  ps_latnode_t *ppVar15;
  char *fmt;
  ps_latnode_s **pppVar16;
  double dVar17;
  int sf;
  int seqid;
  int32 ispipe;
  float64 lb;
  int lef;
  int fef;
  char wd [256];
  frame_idx_t local_180;
  uint local_17c;
  char *local_178;
  float local_16c;
  FILE *local_168;
  int32 local_15c;
  float64 local_158;
  double local_150;
  uint local_144;
  int32 local_140;
  int32 local_13c;
  int local_138 [66];
  
  dag = (ps_lattice_t *)
        __ckd_calloc__(1,0x80,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                       ,0x192);
  if (ps == (ps_decoder_t *)0x0) {
    pdVar9 = dict_init((ps_config_t *)0x0,(bin_mdef_t *)0x0);
    dag->dict = pdVar9;
    plVar10 = logmath_init(1.0001,0,0);
    dag->lmath = plVar10;
    iVar4 = 100;
  }
  else {
    dag->search = ps->search;
    pdVar9 = dict_retain(ps->dict);
    dag->dict = pdVar9;
    plVar10 = logmath_retain(ps->lmath);
    dag->lmath = plVar10;
    lVar11 = ps_config_int(dag->search->config,"frate");
    iVar4 = (int32)lVar11;
  }
  dag->frate = iVar4;
  dag->silence = dag->dict->silwid;
  plVar12 = listelem_alloc_init(0x48);
  dag->latnode_alloc = plVar12;
  plVar12 = listelem_alloc_init(0x30);
  dag->latlink_alloc = plVar12;
  plVar12 = listelem_alloc_init(0x10);
  dag->latlink_list_alloc = plVar12;
  dag->refcount = 1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0x1a7,"Reading DAG file: %s\n",file);
  fh = fopen_compchk(file,&local_15c);
  if (fh == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                   ,0x1a9,"Failed to open DAG file \'%s\' for reading",file);
    return (ps_lattice_t *)0x0;
  }
  plVar13 = lineiter_start(fh);
  if (plVar13 == (lineiter_t *)0x0) {
    lVar11 = 0x1b0;
LAB_001116a1:
    ptr = (void *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,lVar11,"Premature EOF(%s)\n",file);
    plVar13 = (lineiter_t *)0x0;
    goto LAB_001116b3;
  }
  pcVar14 = plVar13->buf;
  iVar2 = strncmp(pcVar14,"# getcwd: ",10);
  if (iVar2 != 0) {
    ptr = (void *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1b4,"%s does not begin with \'# getcwd: \'\n%s",file,pcVar14);
    goto LAB_001116b3;
  }
  plVar13 = lineiter_next(plVar13);
  if (plVar13 == (lineiter_t *)0x0) {
    lVar11 = 0x1b8;
    goto LAB_001116a1;
  }
  pcVar14 = plVar13->buf;
  iVar2 = strncmp(pcVar14,"# -logbase ",0xb);
  if ((iVar2 != 0) || (iVar2 = __isoc99_sscanf(pcVar14 + 0xb,"%lf",&local_158), iVar2 != 1)) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1bd,"%s: Cannot find -logbase in header\n",file);
    local_158 = 1.0001;
  }
  if (dag->lmath == (logmath_t *)0x0) {
    plVar10 = logmath_init(local_158,0,1);
    dag->lmath = plVar10;
LAB_00111873:
    local_16c = 1.0;
  }
  else {
    fVar1 = logmath_get_base(dag->lmath);
    if (ABS((double)local_158 - (double)(float)(double)fVar1) < 0.0001) goto LAB_00111873;
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1c6,"Inconsistent logbases: %f vs %f: will compensate\n");
    local_150 = log((double)local_158);
    dVar17 = log((double)(float)(double)fVar1);
    local_16c = (float)(local_150 / dVar17);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1c8,"Lattice log ratio: %f\n",SUB84((double)local_16c,0));
  }
  iVar2 = dag_param_read(plVar13,"Frames");
  dag->n_frames = iVar2;
  if (iVar2 < 1) {
    pcVar14 = "Frames parameter missing or invalid\n";
    lVar11 = 0x1ce;
  }
  else {
    uVar3 = dag_param_read(plVar13,"Nodes");
    if (0 < (int)uVar3) {
      local_150 = (double)(ulong)uVar3;
      local_178 = file;
      local_168 = fh;
      local_144 = uVar3;
      ptr = __ckd_calloc__((size_t)local_150,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                           ,0x1d9);
      pppVar16 = &dag->nodes;
      dVar17 = 0.0;
      do {
        plVar13 = lineiter_next(plVar13);
        file = local_178;
        if (plVar13 == (lineiter_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,0x1e2,"Premature EOF while loading Nodes(%s)\n",local_178);
          fh = local_168;
          goto LAB_001116b3;
        }
        uVar3 = __isoc99_sscanf(plVar13->buf,"%d %255s %d %d %d",&local_17c,local_138,&local_180,
                                &local_13c,&local_140);
        if (uVar3 != 5) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,0x1e9,"Cannot parse line: %s, value of count %d\n",plVar13->buf,(ulong)uVar3);
          file = local_178;
          fh = local_168;
          goto LAB_001116b3;
        }
        uVar3 = dict_wordid(dag->dict,(char *)local_138);
        if ((int)uVar3 < 0) {
          if (dag->search == (ps_search_t *)0x0) {
            pcVar14 = __ckd_salloc__((char *)local_138,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                     ,0x1f0);
            iVar4 = dict_word2basestr(pcVar14);
            if ((iVar4 != -1) && (sVar5 = dict_wordid(dag->dict,pcVar14), sVar5 == -1)) {
              dict_add_word(dag->dict,pcVar14,(s3cipid_t *)0x0,0);
            }
            ckd_free(pcVar14);
            uVar3 = dict_add_word(dag->dict,(char *)local_138,(s3cipid_t *)0x0,0);
            if (-1 < (int)uVar3) goto LAB_001119c0;
          }
          pcVar14 = plVar13->buf;
          fmt = "Unknown word in line: %s\n";
          lVar11 = 0x1f9;
LAB_00111bfb:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,lVar11,fmt,pcVar14);
          file = local_178;
          fh = local_168;
          goto LAB_001116b3;
        }
LAB_001119c0:
        if (dVar17 != (double)(ulong)local_17c) {
          pcVar14 = plVar13->buf;
          fmt = "Seqno error: %s\n";
          lVar11 = 0x1ff;
          goto LAB_00111bfb;
        }
        ppVar15 = (ps_latnode_t *)
                  __listelem_malloc__(dag->latnode_alloc,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                      ,0x203);
        *pppVar16 = ppVar15;
        *(ps_latnode_t **)((long)ptr + (long)dVar17 * 8) = ppVar15;
        ppVar15->wid = uVar3;
        ppVar15->basewid = dag->dict->word[uVar3].basewid;
        ppVar15->id = local_17c;
        ppVar15->sf = local_180;
        ppVar15->fef = local_13c;
        ppVar15->lef = local_140;
        ppVar15->reachable = 0;
        pppVar16 = &ppVar15->next;
        ppVar15->next = (ps_latnode_s *)0x0;
        ppVar15->exits = (latlink_list_t *)0x0;
        ppVar15->entries = (latlink_list_t *)0x0;
        dVar17 = (double)((long)dVar17 + 1);
      } while (local_150 != dVar17);
      uVar6 = dag_param_read(plVar13,"Initial");
      uVar3 = local_144;
      fh = local_168;
      if (uVar6 < local_144) {
        dag->start = *(ps_latnode_t **)((long)ptr + (ulong)uVar6 * 8);
        uVar6 = dag_param_read(plVar13,"Final");
        file = local_178;
        if (uVar6 < uVar3) {
          dag->end = *(ps_latnode_t **)((long)ptr + (ulong)uVar6 * 8);
          iVar2 = dag_param_read(plVar13,"BestSegAscr");
          if (iVar2 < 0) {
            pcVar14 = "BestSegAscr parameter missing\n";
            lVar11 = 0x224;
          }
          else {
            for (; iVar2 != 0; iVar2 = iVar2 + -1) {
              plVar13 = lineiter_next(plVar13);
              if (plVar13 == (lineiter_t *)0x0) {
                plVar13 = (lineiter_t *)0x0;
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0x22a,"Premature EOF while (%s) ignoring BestSegAscr\n",0);
                goto LAB_001116b3;
              }
            }
            for (plVar13 = lineiter_next(plVar13); plVar13 != (lineiter_t *)0x0;
                plVar13 = lineiter_next(plVar13)) {
              if ((*plVar13->buf != '#') && (iVar2 = strncmp(plVar13->buf,"Edges",5), iVar2 == 0)) {
                plVar13 = lineiter_next(plVar13);
                if (plVar13 == (lineiter_t *)0x0) goto LAB_00111d5d;
                goto LAB_00111cd3;
              }
            }
            pcVar14 = "Edges missing\n";
            plVar13 = (lineiter_t *)0x0;
            lVar11 = 0x237;
          }
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,lVar11,pcVar14);
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,0x21d,"Final node parameter missing or invalid\n");
        }
        goto LAB_001116b3;
      }
      pcVar14 = "Initial node parameter missing or invalid\n";
      lVar11 = 0x215;
      goto LAB_00111c2e;
    }
    pcVar14 = "Nodes parameter missing or invalid\n";
    lVar11 = 0x1d4;
  }
  ptr = (void *)0x0;
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,lVar11,pcVar14);
  goto LAB_001116b3;
  while( true ) {
    if (-0x20000001 < local_180) {
      if ((local_16c != 1.0) || (NAN(local_16c))) {
        local_180 = (frame_idx_t)((float)local_180 * local_16c);
      }
      ppVar15 = *(ps_latnode_t **)((long)ptr + (long)(int)local_17c * 8);
      ps_lattice_link(dag,*(ps_latnode_t **)((long)ptr + (long)local_138[0] * 8),ppVar15,local_180,
                      ppVar15->sf + -1);
    }
    plVar13 = lineiter_next(plVar13);
    if (plVar13 == (lineiter_t *)0x0) break;
LAB_00111cd3:
    iVar2 = __isoc99_sscanf(plVar13->buf,"%d %d %d",local_138,&local_17c,&local_180);
    if (iVar2 != 3) goto LAB_00111d60;
  }
LAB_00111d5d:
  plVar13 = (lineiter_t *)0x0;
LAB_00111d60:
  iVar2 = strcmp(plVar13->buf,"End\n");
  if (iVar2 == 0) {
    lineiter_free(plVar13);
    fclose_comp(fh,local_15c);
    ckd_free(ptr);
    iVar2 = dict_filler_word(dag->dict,dag->end->wid);
    if (iVar2 == 0) {
      ppVar15 = dag->end;
    }
    else {
      if (dag->search == (ps_search_t *)0x0) {
        sVar5 = dict_wordid(dag->dict,"</s>");
      }
      else {
        sVar5 = dag->search->finish_wid;
      }
      ppVar15 = dag->end;
      ppVar15->basewid = sVar5;
    }
    dag_mark_reachable(ppVar15);
    ps_lattice_delete_unreachable(dag);
    if (ps == (ps_decoder_t *)0x0) {
      return dag;
    }
    plVar10 = dag->lmath;
    dVar17 = ps_config_float(ps->config,"pip");
    iVar2 = logmath_log(plVar10,(float64)dVar17);
    plVar10 = dag->lmath;
    dVar17 = ps_config_float(ps->config,"silprob");
    iVar7 = logmath_log(plVar10,(float64)dVar17);
    plVar10 = dag->lmath;
    dVar17 = ps_config_float(ps->config,"fillprob");
    iVar8 = logmath_log(plVar10,(float64)dVar17);
    ps_lattice_penalize_fillers(dag,iVar7 + iVar2,iVar2 + iVar8);
    return dag;
  }
  pcVar14 = "Terminating \'End\' missing\n";
  lVar11 = 0x24a;
LAB_00111c2e:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,lVar11,pcVar14);
  file = local_178;
LAB_001116b3:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0x26f,"Failed to load %s\n",file);
  lineiter_free(plVar13);
  fclose_comp(fh,local_15c);
  ckd_free(ptr);
  return (ps_lattice_t *)0x0;
}

Assistant:

ps_lattice_t *
ps_lattice_read(ps_decoder_t *ps,
                char const *file)
{
    FILE *fp;
    int32 ispipe;
    lineiter_t *line;
    float64 lb;
    float32 logratio;
    ps_latnode_t **darray;
    ps_lattice_t *dag;
    int i, k, n_nodes;
    int32 pip, silpen, fillpen;
    ps_latnode_t **pnodes;

    dag = ckd_calloc(1, sizeof(*dag));

    if (ps) {
        dag->search = ps->search;
        dag->dict = dict_retain(ps->dict);
        dag->lmath = logmath_retain(ps->lmath);
        dag->frate = ps_config_int(dag->search->config, "frate");
    }
    else {
        dag->dict = dict_init(NULL, NULL);
        dag->lmath = logmath_init(1.0001, 0, FALSE);
        dag->frate = 100;
    }
    dag->silence = dict_silwid(dag->dict);
    dag->latnode_alloc = listelem_alloc_init(sizeof(ps_latnode_t));
    dag->latlink_alloc = listelem_alloc_init(sizeof(ps_latlink_t));
    dag->latlink_list_alloc = listelem_alloc_init(sizeof(latlink_list_t));
    dag->refcount = 1;

    darray = NULL;

    E_INFO("Reading DAG file: %s\n", file);
    if ((fp = fopen_compchk(file, &ispipe)) == NULL) {
        E_ERROR_SYSTEM("Failed to open DAG file '%s' for reading", file);
        return NULL;
    }
    line = lineiter_start(fp);

    /* Read and verify logbase (ONE BIG HACK!!) */
    if (line == NULL) {
        E_ERROR("Premature EOF(%s)\n", file);
        goto load_error;
    }
    if (strncmp(line->buf, "# getcwd: ", 10) != 0) {
        E_ERROR("%s does not begin with '# getcwd: '\n%s", file, line->buf);
        goto load_error;
    }
    if ((line = lineiter_next(line)) == NULL) {
        E_ERROR("Premature EOF(%s)\n", file);
        goto load_error;
    }
    if ((strncmp(line->buf, "# -logbase ", 11) != 0)
        || (sscanf(line->buf + 11, "%lf", &lb) != 1)) {
        E_WARN("%s: Cannot find -logbase in header\n", file);
        lb = 1.0001;
    }
    logratio = 1.0f;
    if (dag->lmath == NULL)
        dag->lmath = logmath_init(lb, 0, TRUE);
    else {
        float32 pb = logmath_get_base(dag->lmath);
        if (fabs(lb - pb) >= 0.0001) {
            E_WARN("Inconsistent logbases: %f vs %f: will compensate\n", lb, pb);
            logratio = (float32)(log(lb) / log(pb));
            E_INFO("Lattice log ratio: %f\n", logratio);
        }
    }
    /* Read Frames parameter */
    dag->n_frames = dag_param_read(line, "Frames");
    if (dag->n_frames <= 0) {
        E_ERROR("Frames parameter missing or invalid\n");
        goto load_error;
    }
    /* Read Nodes parameter */
    n_nodes = dag_param_read(line, "Nodes");
    if (n_nodes <= 0) {
        E_ERROR("Nodes parameter missing or invalid\n");
        goto load_error;
    }

    /* Read nodes */
    darray = ckd_calloc(n_nodes, sizeof(*darray));
    pnodes = &dag->nodes;
    for (i = 0; i < n_nodes; i++) {
        int32 w;
        int seqid, sf, fef, lef;
        char wd[256];
        ps_latnode_t *node;

        if ((line = lineiter_next(line)) == NULL) {
            E_ERROR("Premature EOF while loading Nodes(%s)\n", file);
            goto load_error;
        }

        if ((k =
             sscanf(line->buf, "%d %255s %d %d %d", &seqid, wd, &sf, &fef,
                    &lef)) != 5) {
            E_ERROR("Cannot parse line: %s, value of count %d\n", line->buf, k);
            goto load_error;
        }

        w = dict_wordid(dag->dict, wd);
        if (w < 0) {
            if (dag->search == NULL) {
                char *ww = ckd_salloc(wd);
                if (dict_word2basestr(ww) != -1) {
                    if (dict_wordid(dag->dict, ww) == BAD_S3WID)
                        dict_add_word(dag->dict, ww, NULL, 0);
                }
                ckd_free(ww);
                w = dict_add_word(dag->dict, wd, NULL, 0);
            }
            if (w < 0) {
                E_ERROR("Unknown word in line: %s\n", line->buf);
                goto load_error;
            }
        }

        if (seqid != i) {
            E_ERROR("Seqno error: %s\n", line->buf);
            goto load_error;
        }

        *pnodes = listelem_malloc(dag->latnode_alloc);
        node = *pnodes;
        darray[i] = node;
        node->wid = w;
        node->basewid = dict_basewid(dag->dict, w);
        node->id = seqid;
        node->sf = sf;
        node->fef = fef;
        node->lef = lef;
        node->reachable = 0;
        node->exits = node->entries = NULL;
        node->next = NULL;
        pnodes = &node->next;
    }

    /* Read initial node ID */
    k = dag_param_read(line, "Initial");
    if ((k < 0) || (k >= n_nodes)) {
        E_ERROR("Initial node parameter missing or invalid\n");
        goto load_error;
    }
    dag->start = darray[k];

    /* Read final node ID */
    k = dag_param_read(line, "Final");
    if ((k < 0) || (k >= n_nodes)) {
        E_ERROR("Final node parameter missing or invalid\n");
        goto load_error;
    }
    dag->end = darray[k];

    /* Read bestsegscore entries and ignore them. */
    if ((k = dag_param_read(line, "BestSegAscr")) < 0) {
        E_ERROR("BestSegAscr parameter missing\n");
        goto load_error;
    }
    for (i = 0; i < k; i++) {
        if ((line = lineiter_next(line)) == NULL) {
            E_ERROR("Premature EOF while (%s) ignoring BestSegAscr\n",
                    line);
            goto load_error;
        }
    }

    /* Read in edges. */
    while ((line = lineiter_next(line)) != NULL) {
        if (line->buf[0] == '#')
            continue;
        if (0 == strncmp(line->buf, "Edges", 5))
            break;
    }
    if (line == NULL) {
        E_ERROR("Edges missing\n");
        goto load_error;
    }
    while ((line = lineiter_next(line)) != NULL) {
        int from, to, ascr;
        ps_latnode_t *pd, *d;

        if (sscanf(line->buf, "%d %d %d", &from, &to, &ascr) != 3)
            break;
        if (ascr WORSE_THAN WORST_SCORE)
            continue;
        pd = darray[from];
        d = darray[to];
        if (logratio != 1.0f)
            /* FIXME: possible under/overflow!!! */
            ascr = (int32)(ascr * logratio);
        ps_lattice_link(dag, pd, d, ascr, d->sf - 1);
    }
    if (strcmp(line->buf, "End\n") != 0) {
        E_ERROR("Terminating 'End' missing\n");
        goto load_error;
    }
    lineiter_free(line);
    fclose_comp(fp, ispipe);
    ckd_free(darray);

    /* Minor hack: If the final node is a filler word and not </s>,
     * then set its base word ID to </s>, so that the language model
     * scores won't be screwed up. */
    if (dict_filler_word(dag->dict, dag->end->wid))
        dag->end->basewid = dag->search
            ? ps_search_finish_wid(dag->search)
            : dict_wordid(dag->dict, S3_FINISH_WORD);

    /* Mark reachable from dag->end */
    dag_mark_reachable(dag->end);

    /* Free nodes unreachable from dag->end and their links */
    ps_lattice_delete_unreachable(dag);

    if (ps) {
        /* Build links around silence and filler words, since they do
         * not exist in the language model.  FIXME: This is
         * potentially buggy, as we already do this before outputting
         * lattices. */
        pip = logmath_log(dag->lmath, ps_config_float(ps->config, "pip"));
        silpen = pip + logmath_log(dag->lmath,
                                   ps_config_float(ps->config, "silprob"));
        fillpen = pip + logmath_log(dag->lmath,
                                    ps_config_float(ps->config, "fillprob"));
        ps_lattice_penalize_fillers(dag, silpen, fillpen);
    }

    return dag;

  load_error:
    E_ERROR("Failed to load %s\n", file);
    lineiter_free(line);
    fclose_comp(fp, ispipe);
    ckd_free(darray);
    return NULL;
}